

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::MVNParameter::SerializeWithCachedSizes(MVNParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(1,this->normalize_variance_,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,this->across_channels_,output);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(3,this->eps_,output);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  unknown_fields = MVNParameter::unknown_fields(this);
  google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  return;
}

Assistant:

void MVNParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.MVNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool normalize_variance = 1 [default = true];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->normalize_variance(), output);
  }

  // optional bool across_channels = 2 [default = false];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->across_channels(), output);
  }

  // optional float eps = 3 [default = 1e-09];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->eps(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.MVNParameter)
}